

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall
Parser::FinishParseFncExprScope
          (Parser *this,ParseNodeFnc *pnodeFnc,ParseNodeBlock *pnodeFncExprScope)

{
  int blockId;
  IdentPtr pid;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeVar *pPVar4;
  ParseNodeVar *pPVar5;
  
  pPVar5 = pnodeFnc->pnodeName;
  if (pPVar5 != (ParseNodeVar *)0x0) {
    blockId = pnodeFncExprScope->blockId;
    if ((pPVar5->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x729,"(pnodeName->nop == knopVarDecl)","pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pPVar4 = ParseNode::AsParseNodeVar(&pPVar5->super_ParseNode);
    pid = pPVar4->pid;
    pPVar5 = ParseNode::AsParseNodeVar(&pPVar5->super_ParseNode);
    BindPidRefsInScope(this,pid,pPVar5->sym,blockId,this->m_nextBlockId - 1);
  }
  FinishParseBlock(this,pnodeFncExprScope,true);
  return;
}

Assistant:

void Parser::FinishParseFncExprScope(ParseNodeFnc * pnodeFnc, ParseNodeBlock * pnodeFncExprScope)
{
    int fncExprScopeId = pnodeFncExprScope->blockId;
    ParseNodePtr pnodeName = pnodeFnc->pnodeName;
    if (pnodeName)
    {
        Assert(pnodeName->nop == knopVarDecl);
        BindPidRefsInScope(pnodeName->AsParseNodeVar()->pid, pnodeName->AsParseNodeVar()->sym, fncExprScopeId, m_nextBlockId - 1);
    }
    FinishParseBlock(pnodeFncExprScope);
}